

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_AddExt_Test::TestBody(X509Test_AddExt_Test *this)

{
  allocator<unsigned_char> *paVar1;
  allocator<Extension> *paVar2;
  initializer_list<Extension> __l;
  initializer_list<Extension> __l_00;
  initializer_list<Extension> __l_01;
  initializer_list<Extension> __l_02;
  initializer_list<Extension> __l_03;
  initializer_list<Extension> __l_04;
  initializer_list<Extension> __l_05;
  initializer_list<Extension> __l_06;
  initializer_list<Extension> __l_07;
  initializer_list<Extension> __l_08;
  initializer_list<Extension> __l_09;
  initializer_list<Extension> __l_10;
  initializer_list<Extension> __l_11;
  initializer_list<Extension> __l_12;
  initializer_list<Extension> __l_13;
  initializer_list<Extension> __l_14;
  initializer_list<Extension> __l_15;
  initializer_list<unsigned_char> __l_16;
  initializer_list<unsigned_char> __l_17;
  initializer_list<unsigned_char> __l_18;
  initializer_list<unsigned_char> __l_19;
  bool bVar3;
  X509 *pXVar4;
  char *pcVar5;
  size_type sVar6;
  BASIC_CONSTRAINTS *pBVar7;
  uchar *puVar8;
  ASN1_OCTET_STRING *pAVar9;
  pointer pBVar10;
  pointer paVar11;
  char *in_R9;
  Extension *local_12c0;
  Extension *local_1268;
  Extension *local_1210;
  Extension *local_11b0;
  Extension *local_1150;
  Extension *local_10f8;
  Extension *local_1098;
  Extension *local_1040;
  Extension *local_fe0;
  Extension *local_f80;
  Extension *local_f28;
  Extension *local_ed0;
  Extension *local_e70;
  Extension *local_e10;
  Extension *local_db0;
  Extension *local_d50;
  Extension *local_cf0;
  allocator<Extension> local_bf1;
  Extension *local_bf0;
  Extension local_be8;
  iterator local_bc8;
  pointer local_bc0;
  vector<Extension,_std::allocator<Extension>_> local_bb8;
  AssertHelper local_ba0;
  Message local_b98;
  int local_b90 [2];
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_20;
  Extension local_b68;
  undefined4 local_b48;
  undefined1 local_b44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b40;
  iterator local_b28;
  pointer local_b20;
  vector<Extension,_std::allocator<Extension>_> local_b18;
  AssertHelper local_b00;
  Message local_af8;
  int local_af0 [2];
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar_19;
  Extension local_ac8;
  undefined4 local_aa8;
  undefined1 local_aa4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_aa0;
  undefined4 local_a88;
  undefined1 local_a84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a80;
  iterator local_a68;
  pointer local_a60;
  vector<Extension,_std::allocator<Extension>_> local_a58;
  AssertHelper local_a40;
  Message local_a38;
  int local_a30 [2];
  undefined1 local_a28 [8];
  AssertionResult gtest_ar_18;
  Extension local_a08;
  undefined4 local_9e8;
  undefined1 local_9e4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_9e0;
  iterator local_9c8;
  pointer local_9c0;
  vector<Extension,_std::allocator<Extension>_> local_9b8;
  AssertHelper local_9a0;
  Message local_998;
  int local_990 [2];
  undefined1 local_988 [8];
  AssertionResult gtest_ar_17;
  Extension local_968;
  iterator local_948;
  pointer local_940;
  vector<Extension,_std::allocator<Extension>_> local_938;
  AssertHelper local_920;
  Message local_918;
  int local_910 [2];
  undefined1 local_908 [8];
  AssertionResult gtest_ar_16;
  Extension local_8e8;
  undefined4 local_8c8;
  undefined1 local_8c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_8c0;
  iterator local_8a8;
  pointer local_8a0;
  vector<Extension,_std::allocator<Extension>_> local_898;
  AssertHelper local_880;
  Message local_878;
  int local_870 [2];
  undefined1 local_868 [8];
  AssertionResult gtest_ar_15;
  Extension local_848;
  iterator local_828;
  pointer local_820;
  vector<Extension,_std::allocator<Extension>_> local_818;
  AssertHelper local_800;
  Message local_7f8;
  int local_7f0 [2];
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_14;
  Extension local_7c8;
  undefined4 local_7a8;
  undefined1 local_7a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_7a0;
  iterator local_788;
  pointer local_780;
  vector<Extension,_std::allocator<Extension>_> local_778;
  AssertHelper local_760;
  Message local_758;
  int local_750 [2];
  undefined1 local_748 [8];
  AssertionResult gtest_ar_13;
  Extension local_728;
  iterator local_708;
  pointer local_700;
  vector<Extension,_std::allocator<Extension>_> local_6f8;
  AssertHelper local_6e0;
  Message local_6d8;
  int local_6d0 [2];
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_12;
  Extension local_6a8;
  iterator local_688;
  pointer local_680;
  vector<Extension,_std::allocator<Extension>_> local_678;
  AssertHelper local_660;
  Message local_658;
  int local_650 [2];
  undefined1 local_648 [8];
  AssertionResult gtest_ar_11;
  Extension local_628;
  iterator local_608;
  pointer local_600;
  vector<Extension,_std::allocator<Extension>_> local_5f8;
  AssertHelper local_5e0;
  Message local_5d8;
  int local_5d0 [2];
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_10;
  Extension local_5a8;
  undefined4 local_588;
  undefined1 local_584;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_580;
  iterator local_568;
  pointer local_560;
  vector<Extension,_std::allocator<Extension>_> local_558;
  AssertHelper local_540;
  Message local_538;
  int local_530 [2];
  undefined1 local_528 [8];
  AssertionResult gtest_ar_9;
  Extension local_508;
  undefined4 local_4e8;
  undefined1 local_4e4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e0;
  iterator local_4c8;
  pointer local_4c0;
  vector<Extension,_std::allocator<Extension>_> local_4b8;
  AssertHelper local_4a0;
  Message local_498;
  int local_490 [2];
  undefined1 local_488 [8];
  AssertionResult gtest_ar_8;
  Extension local_468;
  undefined4 local_448;
  undefined1 local_444;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_440;
  iterator local_428;
  pointer local_420;
  vector<Extension,_std::allocator<Extension>_> local_418;
  AssertHelper local_400;
  Message local_3f8;
  int local_3f0 [2];
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_7;
  Extension local_3c8;
  undefined4 local_3a8;
  undefined1 local_3a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3a0;
  iterator local_388;
  pointer local_380;
  vector<Extension,_std::allocator<Extension>_> local_378;
  AssertHelper local_360;
  Message local_358;
  int local_350 [2];
  undefined1 local_348 [8];
  AssertionResult gtest_ar_6;
  Extension local_328;
  undefined4 local_308;
  undefined1 local_304;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_300;
  iterator local_2e8;
  pointer local_2e0;
  vector<Extension,_std::allocator<Extension>_> local_2d8;
  AssertHelper local_2c0;
  Message local_2b8;
  int local_2b0 [2];
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_5;
  Extension local_288;
  iterator local_268;
  pointer local_260;
  vector<Extension,_std::allocator<Extension>_> local_258;
  AssertHelper local_240;
  Message local_238;
  int local_230 [2];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_200;
  Message local_1f8;
  uchar *local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  UniquePtr<ASN1_OCTET_STRING> skid2_obj;
  undefined1 local_1b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> skid2_der;
  Message local_198;
  uchar *local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  UniquePtr<ASN1_OCTET_STRING> skid1_obj;
  undefined1 local_158 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> skid1_der;
  Message local_138;
  uchar *local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  UniquePtr<BASIC_CONSTRAINTS> basic2_obj;
  undefined1 local_f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> basic2_der;
  Message local_d8;
  uchar *local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  UniquePtr<BASIC_CONSTRAINTS> basic1_obj;
  uint8_t *inp;
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> basic1_der;
  anon_class_8_1_89930684 expect_extensions;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509> x509;
  X509Test_AddExt_Test *this_local;
  
  pXVar4 = X509_new();
  std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<x509_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pXVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar3) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x88f80e,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1593,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar3) {
    basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&gtest_ar_.message_;
    inp._6_1_ = 0x30;
    inp._7_1_ = 0;
    local_a0 = (iterator)((long)&inp + 6);
    local_98 = 2;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&inp + 5));
    __l_19._M_len = local_98;
    __l_19._M_array = local_a0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,__l_19,
               (allocator<unsigned_char> *)((long)&inp + 5));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&inp + 5));
    basic1_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter,_true,_true>)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    pBVar7 = d2i_BASIC_CONSTRAINTS((BASIC_CONSTRAINTS **)0x0,(uchar **)&basic1_obj,sVar6);
    std::unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter> *)&gtest_ar.message_,
               (pointer)pBVar7);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_d0 = puVar8 + sVar6;
    testing::internal::EqHelper::Compare<const_unsigned_char_*,_unsigned_char_*,_nullptr>
              ((EqHelper *)local_c8,"inp","basic1_der.data() + basic1_der.size()",
               (uchar **)&basic1_obj,&local_d0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar3) {
      testing::Message::Message(&local_d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15ae,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    basic2_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl._3_1_ = 0x30;
    basic2_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl._4_1_ = 3;
    basic2_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl._5_1_ = 1;
    basic2_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl._6_1_ = 1;
    basic2_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl._7_1_ = 0xff;
    paVar1 = (allocator<unsigned_char> *)
             ((long)&basic2_obj._M_t.
                     super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl + 2);
    std::allocator<unsigned_char>::allocator(paVar1);
    __l_18._M_len = 5;
    __l_18._M_array =
         (iterator)
         ((long)&basic2_obj._M_t.
                 super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl + 3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,__l_18,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&basic2_obj._M_t.
                       super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl + 2));
    basic1_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter,_true,_true>)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    pBVar7 = d2i_BASIC_CONSTRAINTS((BASIC_CONSTRAINTS **)0x0,(uchar **)&basic1_obj,sVar6);
    std::unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter> *)&gtest_ar_1.message_,
               (pointer)pBVar7);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    local_130 = puVar8 + sVar6;
    testing::internal::EqHelper::Compare<const_unsigned_char_*,_unsigned_char_*,_nullptr>
              ((EqHelper *)local_128,"inp","basic2_der.data() + basic2_der.size()",
               (uchar **)&basic1_obj,&local_130);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar3) {
      testing::Message::Message(&local_138);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15b5,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_138);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    skid1_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._6_1_ = 4;
    skid1_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._7_1_ = 0;
    paVar1 = (allocator<unsigned_char> *)
             ((long)&skid1_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 5);
    std::allocator<unsigned_char>::allocator(paVar1);
    __l_17._M_len = 2;
    __l_17._M_array =
         (iterator)
         ((long)&skid1_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158,__l_17,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&skid1_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>
                       ._M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 5));
    basic1_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter,_true,_true>)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    pAVar9 = d2i_ASN1_OCTET_STRING((ASN1_OCTET_STRING **)0x0,(uchar **)&basic1_obj,sVar6);
    std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar_2.message_,
               (pointer)pAVar9);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    local_190 = puVar8 + sVar6;
    testing::internal::EqHelper::Compare<const_unsigned_char_*,_unsigned_char_*,_nullptr>
              ((EqHelper *)local_188,"inp","skid1_der.data() + skid1_der.size()",
               (uchar **)&basic1_obj,&local_190);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar3) {
      testing::Message::Message(&local_198);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15bc,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_198);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._5_1_ = 4;
    skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._6_1_ = 1;
    skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._7_1_ = 0x61;
    paVar1 = (allocator<unsigned_char> *)
             ((long)&skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 4);
    std::allocator<unsigned_char>::allocator(paVar1);
    __l_16._M_len = 3;
    __l_16._M_array =
         (iterator)
         ((long)&skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8,__l_16,paVar1);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               ((long)&skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>
                       ._M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 4));
    basic1_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter,_true,_true>)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    pAVar9 = d2i_ASN1_OCTET_STRING((ASN1_OCTET_STRING **)0x0,(uchar **)&basic1_obj,sVar6);
    std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar_3.message_,
               (pointer)pAVar9);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_1f0 = puVar8 + sVar6;
    testing::internal::EqHelper::Compare<const_unsigned_char_*,_unsigned_char_*,_nullptr>
              ((EqHelper *)local_1e8,"inp","skid2_der.data() + skid2_der.size()",
               (uchar **)&basic1_obj,&local_1f0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar3) {
      testing::Message::Message(&local_1f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15c3,pcVar5);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    gtest_ar_4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::vector<Extension,_std::allocator<Extension>_>::vector
              ((vector<Extension,_std::allocator<Extension>_> *)&gtest_ar_4.message_);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,
               (vector<Extension,_std::allocator<Extension>_> *)&gtest_ar_4.message_);
    std::vector<Extension,_std::allocator<Extension>_>::~vector
              ((vector<Extension,_std::allocator<Extension>_> *)&gtest_ar_4.message_);
    local_230[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar.message_);
    local_230[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,1,0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_228,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 0L)",local_230 + 1,local_230)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
    if (!bVar3) {
      testing::Message::Message(&local_238);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15cb,pcVar5);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message(&local_238);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
    local_288.nid = 0x57;
    local_288.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_288.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_268 = &local_288;
    local_260 = (pointer)0x1;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_15._M_len = (size_type)local_260;
    __l_15._M_array = local_268;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_258,__l_15,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_258);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_258);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_5.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_cf0 = (Extension *)&local_268;
    do {
      local_cf0 = local_cf0 + -1;
      TestBody::Extension::~Extension(local_cf0);
    } while (local_cf0 != &local_288);
    local_2b0[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    paVar11 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_2.message_
                        );
    local_2b0[0] = X509_add1_ext_i2d(pXVar4,0x52,paVar11,0,0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_2a8,"1","X509_add1_ext_i2d(x509.get(), 82, skid1_obj.get(), 0, 0L)"
               ,local_2b0 + 1,local_2b0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
    if (!bVar3) {
      testing::Message::Message(&local_2b8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15cf,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
    local_328.nid = 0x57;
    local_328.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_328.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_308 = 0x52;
    local_304 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_300,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    local_2e8 = &local_328;
    local_2e0 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_14._M_len = (size_type)local_2e0;
    __l_14._M_array = local_2e8;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_2d8,__l_14,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_2d8);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_2d8);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_6.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_d50 = (Extension *)&local_2e8;
    do {
      local_d50 = local_d50 + -1;
      TestBody::Extension::~Extension(local_d50);
    } while (local_d50 != &local_328);
    local_350[1] = 0;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar_1.message_);
    local_350[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,0,0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_348,"0",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 0L)",local_350 + 1,local_350)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar3) {
      testing::Message::Message(&local_358);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15d6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      testing::Message::~Message(&local_358);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    local_3c8.nid = 0x57;
    local_3c8.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_3c8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_3a8 = 0x52;
    local_3a4 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_3a0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    local_388 = &local_3c8;
    local_380 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_13._M_len = (size_type)local_380;
    __l_13._M_array = local_388;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_378,__l_13,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_378);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_378);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_7.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_db0 = (Extension *)&local_388;
    do {
      local_db0 = local_db0 + -1;
      TestBody::Extension::~Extension(local_db0);
    } while (local_db0 != &local_3c8);
    local_3f0[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar_1.message_);
    local_3f0[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,0,4);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_3e8,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 4L)",local_3f0 + 1,local_3f0)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
    if (!bVar3) {
      testing::Message::Message(&local_3f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_400,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15de,pcVar5);
      testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
      testing::internal::AssertHelper::~AssertHelper(&local_400);
      testing::Message::~Message(&local_3f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
    local_468.nid = 0x57;
    local_468.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_468.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_448 = 0x52;
    local_444 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_440,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    local_428 = &local_468;
    local_420 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_8.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_12._M_len = (size_type)local_420;
    __l_12._M_array = local_428;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_418,__l_12,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_418);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_418);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_8.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_e10 = (Extension *)&local_428;
    do {
      local_e10 = local_e10 + -1;
      TestBody::Extension::~Extension(local_e10);
    } while (local_e10 != &local_468);
    local_490[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar_1.message_);
    local_490[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,0,2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_488,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 2L)",local_490 + 1,local_490)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
    if (!bVar3) {
      testing::Message::Message(&local_498);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15e5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      testing::Message::~Message(&local_498);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
    local_508.nid = 0x57;
    local_508.critical = false;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_508.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    local_4e8 = 0x52;
    local_4e4 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_4e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    local_4c8 = &local_508;
    local_4c0 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_11._M_len = (size_type)local_4c0;
    __l_11._M_array = local_4c8;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_4b8,__l_11,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_4b8);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_4b8);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_9.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_e70 = (Extension *)&local_4c8;
    do {
      local_e70 = local_e70 + -1;
      TestBody::Extension::~Extension(local_e70);
    } while (local_e70 != &local_508);
    local_530[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    paVar11 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_3.message_
                        );
    local_530[0] = X509_add1_ext_i2d(pXVar4,0x52,paVar11,1,3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_528,"1","X509_add1_ext_i2d(x509.get(), 82, skid2_obj.get(), 1, 3L)"
               ,local_530 + 1,local_530);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
    if (!bVar3) {
      testing::Message::Message(&local_538);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
      testing::internal::AssertHelper::AssertHelper
                (&local_540,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15ec,pcVar5);
      testing::internal::AssertHelper::operator=(&local_540,&local_538);
      testing::internal::AssertHelper::~AssertHelper(&local_540);
      testing::Message::~Message(&local_538);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
    local_5a8.nid = 0x57;
    local_5a8.critical = false;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_5a8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    local_588 = 0x52;
    local_584 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_580,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_568 = &local_5a8;
    local_560 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_10.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_10._M_len = (size_type)local_560;
    __l_10._M_array = local_568;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_558,__l_10,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_558);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_558);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_10.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_ed0 = (Extension *)&local_568;
    do {
      local_ed0 = local_ed0 + -1;
      TestBody::Extension::~Extension(local_ed0);
    } while (local_ed0 != &local_5a8);
    local_5d0[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    local_5d0[0] = X509_add1_ext_i2d(pXVar4,0x57,(void *)0x0,0,5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_5c8,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               local_5d0 + 1,local_5d0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
    if (!bVar3) {
      testing::Message::Message(&local_5d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_5e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15f2,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
      testing::internal::AssertHelper::~AssertHelper(&local_5e0);
      testing::Message::~Message(&local_5d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
    local_628.nid = 0x52;
    local_628.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_628.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_608 = &local_628;
    local_600 = (pointer)0x1;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_11.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_09._M_len = (size_type)local_600;
    __l_09._M_array = local_608;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_5f8,__l_09,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_5f8);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_5f8);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_11.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_f28 = (Extension *)&local_608;
    do {
      local_f28 = local_f28 + -1;
      TestBody::Extension::~Extension(local_f28);
    } while (local_f28 != &local_628);
    local_650[1] = 0;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    local_650[0] = X509_add1_ext_i2d(pXVar4,0x57,(void *)0x0,0,5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_648,"0","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               local_650 + 1,local_650);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar3) {
      testing::Message::Message(&local_658);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
      testing::internal::AssertHelper::AssertHelper
                (&local_660,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15f7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_660,&local_658);
      testing::internal::AssertHelper::~AssertHelper(&local_660);
      testing::Message::~Message(&local_658);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    local_6a8.nid = 0x52;
    local_6a8.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_6a8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_688 = &local_6a8;
    local_680 = (pointer)0x1;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_08._M_len = (size_type)local_680;
    __l_08._M_array = local_688;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_678,__l_08,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_678);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_678);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_12.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_f80 = (Extension *)&local_688;
    do {
      local_f80 = local_f80 + -1;
      TestBody::Extension::~Extension(local_f80);
    } while (local_f80 != &local_6a8);
    local_6d0[1] = 0;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar.message_);
    local_6d0[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,1,3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_6c8,"0",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 3L)",local_6d0 + 1,local_6d0)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
    if (!bVar3) {
      testing::Message::Message(&local_6d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_6e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15fd,pcVar5);
      testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
      testing::internal::AssertHelper::~AssertHelper(&local_6e0);
      testing::Message::~Message(&local_6d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
    local_728.nid = 0x52;
    local_728.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_728.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_708 = &local_728;
    local_700 = (pointer)0x1;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_13.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_07._M_len = (size_type)local_700;
    __l_07._M_array = local_708;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_6f8,__l_07,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_6f8);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_6f8);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_13.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_fe0 = (Extension *)&local_708;
    do {
      local_fe0 = local_fe0 + -1;
      TestBody::Extension::~Extension(local_fe0);
    } while (local_fe0 != &local_728);
    local_750[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar.message_);
    local_750[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,1,2);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_748,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 2L)",local_750 + 1,local_750)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
    if (!bVar3) {
      testing::Message::Message(&local_758);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
      testing::internal::AssertHelper::AssertHelper
                (&local_760,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1603,pcVar5);
      testing::internal::AssertHelper::operator=(&local_760,&local_758);
      testing::internal::AssertHelper::~AssertHelper(&local_760);
      testing::Message::~Message(&local_758);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
    local_7c8.nid = 0x52;
    local_7c8.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_7c8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_7a8 = 0x57;
    local_7a4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_7a0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_788 = &local_7c8;
    local_780 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_14.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_06._M_len = (size_type)local_780;
    __l_06._M_array = local_788;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_778,__l_06,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_778);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_778);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_14.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_1040 = (Extension *)&local_788;
    do {
      local_1040 = local_1040 + -1;
      TestBody::Extension::~Extension(local_1040);
    } while (local_1040 != &local_7c8);
    local_7f0[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    local_7f0[0] = X509_add1_ext_i2d(pXVar4,0x57,(void *)0x0,0,5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_7e8,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               local_7f0 + 1,local_7f0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
    if (!bVar3) {
      testing::Message::Message(&local_7f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_800,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1609,pcVar5);
      testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
      testing::internal::AssertHelper::~AssertHelper(&local_800);
      testing::Message::~Message(&local_7f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
    local_848.nid = 0x52;
    local_848.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_848.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_828 = &local_848;
    local_820 = (pointer)0x1;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_15.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_05._M_len = (size_type)local_820;
    __l_05._M_array = local_828;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_818,__l_05,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_818);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_818);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_15.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_1098 = (Extension *)&local_828;
    do {
      local_1098 = local_1098 + -1;
      TestBody::Extension::~Extension(local_1098);
    } while (local_1098 != &local_848);
    local_870[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar.message_);
    local_870[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,1,4);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_868,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 4L)",local_870 + 1,local_870)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
    if (!bVar3) {
      testing::Message::Message(&local_878);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
      testing::internal::AssertHelper::AssertHelper
                (&local_880,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x160f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_880,&local_878);
      testing::internal::AssertHelper::~AssertHelper(&local_880);
      testing::Message::~Message(&local_878);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
    local_8e8.nid = 0x52;
    local_8e8.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_8e8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_8c8 = 0x57;
    local_8c4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_8c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_8a8 = &local_8e8;
    local_8a0 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_16.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_04._M_len = (size_type)local_8a0;
    __l_04._M_array = local_8a8;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_898,__l_04,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_898);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_898);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_16.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_10f8 = (Extension *)&local_8a8;
    do {
      local_10f8 = local_10f8 + -1;
      TestBody::Extension::~Extension(local_10f8);
    } while (local_10f8 != &local_8e8);
    local_910[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    local_910[0] = X509_add1_ext_i2d(pXVar4,0x57,(void *)0x0,0,5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_908,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               local_910 + 1,local_910);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
    if (!bVar3) {
      testing::Message::Message(&local_918);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_908);
      testing::internal::AssertHelper::AssertHelper
                (&local_920,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1615,pcVar5);
      testing::internal::AssertHelper::operator=(&local_920,&local_918);
      testing::internal::AssertHelper::~AssertHelper(&local_920);
      testing::Message::~Message(&local_918);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
    local_968.nid = 0x52;
    local_968.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_968.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_948 = &local_968;
    local_940 = (pointer)0x1;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_17.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_03._M_len = (size_type)local_940;
    __l_03._M_array = local_948;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_938,__l_03,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_938);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_938);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_17.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_1150 = (Extension *)&local_948;
    do {
      local_1150 = local_1150 + -1;
      TestBody::Extension::~Extension(local_1150);
    } while (local_1150 != &local_968);
    local_990[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar.message_);
    local_990[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,1,1);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_988,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 1L)",local_990 + 1,local_990)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_988);
    if (!bVar3) {
      testing::Message::Message(&local_998);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_988);
      testing::internal::AssertHelper::AssertHelper
                (&local_9a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x161b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_9a0,&local_998);
      testing::internal::AssertHelper::~AssertHelper(&local_9a0);
      testing::Message::~Message(&local_998);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_988);
    local_a08.nid = 0x52;
    local_a08.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a08.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_9e8 = 0x57;
    local_9e4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_9e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_9c8 = &local_a08;
    local_9c0 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_18.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_02._M_len = (size_type)local_9c0;
    __l_02._M_array = local_9c8;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_9b8,__l_02,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_9b8);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_9b8);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_18.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_11b0 = (Extension *)&local_9c8;
    do {
      local_11b0 = local_11b0 + -1;
      TestBody::Extension::~Extension(local_11b0);
    } while (local_11b0 != &local_a08);
    local_a30[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    pBVar10 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                         &gtest_ar_1.message_);
    local_a30[0] = X509_add1_ext_i2d(pXVar4,0x57,pBVar10,0,1);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_a28,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 1L)",local_a30 + 1,local_a30)
    ;
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
    if (!bVar3) {
      testing::Message::Message(&local_a38);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a28);
      testing::internal::AssertHelper::AssertHelper
                (&local_a40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1622,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a40,&local_a38);
      testing::internal::AssertHelper::~AssertHelper(&local_a40);
      testing::Message::~Message(&local_a38);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
    local_ac8.nid = 0x52;
    local_ac8.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_ac8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_aa8 = 0x57;
    local_aa4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_aa0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    local_a88 = 0x57;
    local_a84 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a80,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    local_a68 = &local_ac8;
    local_a60 = (pointer)0x3;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_19.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_01._M_len = (size_type)local_a60;
    __l_01._M_array = local_a68;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_a58,__l_01,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_a58);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_a58);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_19.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_1210 = (Extension *)&local_a68;
    do {
      local_1210 = local_1210 + -1;
      TestBody::Extension::~Extension(local_1210);
    } while (local_1210 != &local_ac8);
    local_af0[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    local_af0[0] = X509_add1_ext_i2d(pXVar4,0x57,(void *)0x0,0,5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_ae8,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               local_af0 + 1,local_af0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
    if (!bVar3) {
      testing::Message::Message(&local_af8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
      testing::internal::AssertHelper::AssertHelper
                (&local_b00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1629,pcVar5);
      testing::internal::AssertHelper::operator=(&local_b00,&local_af8);
      testing::internal::AssertHelper::~AssertHelper(&local_b00);
      testing::Message::~Message(&local_af8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
    local_b68.nid = 0x52;
    local_b68.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_b68.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_b48 = 0x57;
    local_b44 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_b40,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    local_b28 = &local_b68;
    local_b20 = (pointer)0x2;
    paVar2 = (allocator<Extension> *)
             ((long)&gtest_ar_20.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
    std::allocator<Extension>::allocator(paVar2);
    __l_00._M_len = (size_type)local_b20;
    __l_00._M_array = local_b28;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_b18,__l_00,paVar2);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_b18);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_b18);
    std::allocator<Extension>::~allocator
              ((allocator<Extension> *)
               ((long)&gtest_ar_20.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_1268 = (Extension *)&local_b28;
    do {
      local_1268 = local_1268 + -1;
      TestBody::Extension::~Extension(local_1268);
    } while (local_1268 != &local_b68);
    local_b90[1] = 1;
    pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
    ;
    local_b90[0] = X509_add1_ext_i2d(pXVar4,0x57,(void *)0x0,0,5);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_b88,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               local_b90 + 1,local_b90);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b88);
    if (!bVar3) {
      testing::Message::Message(&local_b98);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b88);
      testing::internal::AssertHelper::AssertHelper
                (&local_ba0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x162d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_ba0,&local_b98);
      testing::internal::AssertHelper::~AssertHelper(&local_ba0);
      testing::Message::~Message(&local_b98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b88);
    local_bf0 = &local_be8;
    local_be8.nid = 0x52;
    local_be8.critical = true;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_be8.data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    local_bc8 = &local_be8;
    local_bc0 = (pointer)0x1;
    std::allocator<Extension>::allocator(&local_bf1);
    __l._M_len = (size_type)local_bc0;
    __l._M_array = local_bc8;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_bb8,__l,&local_bf1);
    TestBody::anon_class_8_1_89930684::operator()
              ((anon_class_8_1_89930684 *)
               &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&local_bb8);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_bb8);
    std::allocator<Extension>::~allocator(&local_bf1);
    local_12c0 = (Extension *)&local_bc8;
    do {
      local_12c0 = local_12c0 + -1;
      TestBody::Extension::~Extension(local_12c0);
    } while (local_12c0 != &local_be8);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_3.message_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b8);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar_2.message_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&gtest_ar_1.message_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, AddExt) {
  bssl::UniquePtr<X509> x509(X509_new());
  ASSERT_TRUE(x509);

  struct Extension {
    int nid;
    bool critical;
    std::vector<uint8_t> data;
  };
  auto expect_extensions = [&](const std::vector<Extension> &exts) {
    ASSERT_EQ(static_cast<size_t>(X509_get_ext_count(x509.get())), exts.size());
    for (size_t i = 0; i < exts.size(); i++) {
      SCOPED_TRACE(i);
      const X509_EXTENSION *ext = X509_get_ext(x509.get(), static_cast<int>(i));
      EXPECT_EQ(OBJ_obj2nid(X509_EXTENSION_get_object(ext)), exts[i].nid);
      EXPECT_EQ(X509_EXTENSION_get_critical(ext), exts[i].critical ? 1 : 0);
      const ASN1_OCTET_STRING *data = X509_EXTENSION_get_data(ext);
      EXPECT_EQ(Bytes(ASN1_STRING_get0_data(data), ASN1_STRING_length(data)),
                Bytes(exts[i].data));
    }
  };

  // Make a few sample extensions.

  // SEQUENCE {}
  std::vector<uint8_t> basic1_der = {0x30, 0x00};
  const uint8_t *inp = basic1_der.data();
  bssl::UniquePtr<BASIC_CONSTRAINTS> basic1_obj(
      d2i_BASIC_CONSTRAINTS(nullptr, &inp, basic1_der.size()));
  EXPECT_EQ(inp, basic1_der.data() + basic1_der.size());

  // SEQUENCE { BOOLEAN { TRUE } }
  std::vector<uint8_t> basic2_der = {0x30, 0x03, 0x01, 0x01, 0xff};
  inp = basic2_der.data();
  bssl::UniquePtr<BASIC_CONSTRAINTS> basic2_obj(
      d2i_BASIC_CONSTRAINTS(nullptr, &inp, basic2_der.size()));
  EXPECT_EQ(inp, basic2_der.data() + basic2_der.size());

  // OCTET_STRING {}
  std::vector<uint8_t> skid1_der = {0x04, 0x00};
  inp = skid1_der.data();
  bssl::UniquePtr<ASN1_OCTET_STRING> skid1_obj(
      d2i_ASN1_OCTET_STRING(nullptr, &inp, skid1_der.size()));
  EXPECT_EQ(inp, skid1_der.data() + skid1_der.size());

  // OCTET_STRING { "a" }
  std::vector<uint8_t> skid2_der = {0x04, 0x01, 0x61};
  inp = skid2_der.data();
  bssl::UniquePtr<ASN1_OCTET_STRING> skid2_obj(
      d2i_ASN1_OCTET_STRING(nullptr, &inp, skid2_der.size()));
  EXPECT_EQ(inp, skid2_der.data() + skid2_der.size());

  // Initially, the extension list is empty.
  expect_extensions({});

  // Adding extensions works with the default settings.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der}});
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_subject_key_identifier,
                                 skid1_obj.get(),
                                 /*crit=*/0, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // By default, we cannot add duplicates.
  EXPECT_EQ(
      0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_KEEP_EXISTING| silently keeps the existing extension if already
  // present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_KEEP_EXISTING));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_REPLACE| replaces it.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_REPLACE));
  expect_extensions({{NID_basic_constraints, false, basic2_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_REPLACE_EXISTING| also replaces matches.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_subject_key_identifier,
                                 skid2_obj.get(),
                                 /*crit=*/1, X509V3_ADD_REPLACE_EXISTING));
  expect_extensions({{NID_basic_constraints, false, basic2_der},
                     {NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_DELETE| ignores the value and deletes the extension.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // Not finding an extension to delete is an error.
  EXPECT_EQ(0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_REPLACE_EXISTING| fails if it cannot find a match.
  EXPECT_EQ(
      0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_REPLACE_EXISTING));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_REPLACE| adds a new extension if not preseent.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_REPLACE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // Delete the extension again.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_KEEP_EXISTING| adds a new extension if not preseent.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_KEEP_EXISTING));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // Delete the extension again.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_APPEND| adds a new extension if not present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_APPEND));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // |X509V3_ADD_APPEND| keeps adding duplicates (invalid) even if present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_APPEND));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der},
                     {NID_basic_constraints, false, basic2_der}});

  // |X509V3_ADD_DELETE| only deletes one extension at a time.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, false, basic2_der}});
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});
}